

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

void __thiscall Jupiter::IRC::Client::reconnect(Client *this)

{
  pointer ppPVar1;
  uint uVar2;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  int in_ESI;
  Plugin **plugin;
  pointer ppPVar3;
  
  if (this->m_connection_status != 0) {
    in_ESI = 0;
    disconnect(this,false);
    in_RDX = extraout_RDX;
  }
  this->m_reconnect_attempts = this->m_reconnect_attempts + 1;
  uVar2 = connect(this,in_ESI,in_RDX,in_ECX);
  (*(this->super_Thinker)._vptr_Thinker[5])(this,(ulong)(uVar2 & 0xff));
  ppPVar1 = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar3 = g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppPVar3 != ppPVar1;
      ppPVar3 = ppPVar3 + 1) {
    (*((*ppPVar3)->super_Thinker)._vptr_Thinker[9])(*ppPVar3,this,(ulong)(uVar2 & 0xff));
  }
  return;
}

Assistant:

void Jupiter::IRC::Client::reconnect()
{
	if (m_connection_status != 0) Jupiter::IRC::Client::disconnect();
	m_reconnect_attempts++;
	bool successConnect = Jupiter::IRC::Client::connect();
	this->OnReconnectAttempt(successConnect);
	for (auto& plugin : Jupiter::plugins) {
		plugin->OnReconnectAttempt(this, successConnect);
	}
}